

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O0

Iterator __thiscall List<String>::removeBack(List<String> *this)

{
  int iVar1;
  undefined4 extraout_var;
  Iterator local_20;
  List<String> *local_18;
  List<String> *this_local;
  
  local_18 = this;
  Iterator::Iterator(&local_20,((this->_end).item)->prev);
  iVar1 = remove(this,(char *)&local_20);
  return (Iterator)(Item *)CONCAT44(extraout_var,iVar1);
}

Assistant:

Iterator removeBack() {return remove(Iterator(_end.item->prev));}